

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_nonce_function_musig_helper
               (secp256k1_sha256 *sha,uint prefix_size,uchar *data,uchar len)

{
  undefined1 in_CL;
  uchar *in_RDX;
  undefined4 in_ESI;
  uchar zero [7];
  uint7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  memset(&stack0xffffffffffffffe0,0,7);
  secp256k1_sha256_write
            ((secp256k1_sha256 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             CONCAT17(in_CL,in_stack_ffffffffffffffe0));
  if (in_RDX == (uchar *)0x0) {
    secp256k1_sha256_write
              ((secp256k1_sha256 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uchar *)0x0,
               (ulong)in_stack_ffffffffffffffe0);
  }
  else {
    secp256k1_sha256_write
              ((secp256k1_sha256 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
               CONCAT17(in_CL,in_stack_ffffffffffffffe0));
    secp256k1_sha256_write
              ((secp256k1_sha256 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
               CONCAT17(in_CL,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

static void secp256k1_nonce_function_musig_helper(secp256k1_sha256 *sha, unsigned int prefix_size, const unsigned char *data, unsigned char len) {
    unsigned char zero[7] = { 0 };
    /* The spec requires length prefixes to be between 1 and 8 bytes
     * (inclusive) */
    VERIFY_CHECK(prefix_size >= 1 && prefix_size <= 8);
    /* Since the length of all input data fits in a byte, we can always pad the
     * length prefix with prefix_size - 1 zero bytes. */
    secp256k1_sha256_write(sha, zero, prefix_size - 1);
    if (data != NULL) {
        secp256k1_sha256_write(sha, &len, 1);
        secp256k1_sha256_write(sha, data, len);
    } else {
        len = 0;
        secp256k1_sha256_write(sha, &len, 1);
    }
}